

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

void Gia_ManPrintChains(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap,Vec_Wec_t *vChains)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  uint local_40;
  int Count;
  int iFadd;
  int k;
  int i;
  Vec_Int_t *vChain;
  Vec_Wec_t *vChains_local;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vFadds_local;
  Gia_Man_t *p_local;
  
  local_40 = 0;
  iFadd = 0;
  do {
    iVar1 = Vec_WecSize(vChains);
    if (iVar1 <= iFadd) {
      uVar3 = Vec_WecSize(vChains);
      printf("Total chains = %d. Total full-adders = %d.\n",(ulong)uVar3,(ulong)local_40);
      return;
    }
    p_00 = Vec_WecEntry(vChains,iFadd);
    iVar1 = Vec_IntSize(p_00);
    local_40 = iVar1 + local_40;
    if (iFadd < 10) {
      uVar3 = Vec_IntSize(p_00);
      printf("Chain %4d : %4d    ",(ulong)(uint)iFadd,(ulong)uVar3);
      for (Count = 0; iVar1 = Vec_IntSize(p_00), Count < iVar1; Count = Count + 1) {
        uVar3 = Vec_IntEntry(p_00,Count);
        uVar2 = Vec_IntEntry(vFadds,uVar3 * 5 + 4);
        printf("%d(%d) ",(ulong)uVar3,(ulong)uVar2);
        iVar1 = Vec_IntSize(p_00);
        if (Count != iVar1 + -1) {
          printf("-> ");
        }
        if (6 < Count) {
          printf("...");
          break;
        }
      }
      printf("\n");
    }
    else if (iFadd == 10) {
      printf("...\n");
    }
    iFadd = iFadd + 1;
  } while( true );
}

Assistant:

void Gia_ManPrintChains( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains )
{
    Vec_Int_t * vChain;
    int i, k, iFadd, Count = 0;
    Vec_WecForEachLevel( vChains, vChain, i )
    {
        Count += Vec_IntSize(vChain);
        if ( i < 10 )
        {
            printf( "Chain %4d : %4d    ", i, Vec_IntSize(vChain) );
            Vec_IntForEachEntry( vChain, iFadd, k )
            {
                printf( "%d(%d) ", iFadd, Vec_IntEntry(vFadds, 5*iFadd+4) );
                if ( k != Vec_IntSize(vChain) - 1 )
                    printf( "-> " );
                if ( k > 6 )
                {
                    printf( "..." );
                    break;
                }
            }
            printf( "\n" );
        }
        else if ( i == 10 )
            printf( "...\n" );

    }
    printf( "Total chains = %d. Total full-adders = %d.\n", Vec_WecSize(vChains), Count );
}